

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u8.cpp
# Opt level: O0

void ucnv_toUnicode_UTF8(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  UConverter *cnv_00;
  UChar *pUVar2;
  UChar *pUVar3;
  UBool UVar4;
  UBool UVar5;
  UChar UVar6;
  uint uVar7;
  UChar *pUVar8;
  int local_64;
  int local_5c;
  int local_58;
  int32_t inBytes;
  int32_t i;
  uint32_t ch2;
  uint32_t ch;
  UBool isCESU8;
  uchar *toUBytes;
  UChar *targetLimit;
  uchar *sourceLimit;
  UChar *myTarget;
  uchar *mySource;
  UConverter *cnv;
  UErrorCode *err_local;
  UConverterToUnicodeArgs *args_local;
  
  cnv_00 = args->converter;
  myTarget = (UChar *)args->source;
  sourceLimit = (uchar *)args->target;
  pUVar2 = (UChar *)args->sourceLimit;
  pUVar3 = args->targetLimit;
  UVar4 = hasCESU8Data(cnv_00);
  if (cnv_00->toULength < '\x01') goto LAB_003822bb;
  if (pUVar3 <= sourceLimit) goto LAB_003822bb;
  local_5c = cnv_00->mode;
  local_58 = (int)cnv_00->toULength;
  cnv_00->toULength = '\0';
  i = cnv_00->toUnicodeStatus;
  cnv_00->toUnicodeStatus = 0;
  do {
    for (; local_58 < local_5c; local_58 = local_58 + 1) {
      if (pUVar2 <= myTarget) {
        cnv_00->toUnicodeStatus = i;
        cnv_00->mode = local_5c;
        cnv_00->toULength = (int8_t)local_58;
LAB_00382530:
        if (((myTarget < pUVar2) && (pUVar3 <= sourceLimit)) &&
           (UVar4 = U_SUCCESS(*err), UVar4 != '\0')) {
          *err = U_BUFFER_OVERFLOW_ERROR;
        }
        args->target = (UChar *)sourceLimit;
        args->source = (char *)myTarget;
        return;
      }
      bVar1 = (byte)*myTarget;
      cnv_00->toUBytes[local_58] = bVar1;
      UVar5 = icu_63::UTF8::isValidTrail(i,bVar1,local_58,local_5c);
      if ((UVar5 == '\0') &&
         ((((UVar4 == '\0' || (local_58 != 1)) || (i != 0xed)) || (-0x41 < (char)bVar1)))) break;
      i = i * 0x40 + (uint)bVar1;
      myTarget = (UChar *)((long)myTarget + 1);
    }
    if ((local_58 != local_5c) || ((UVar4 != '\0' && (3 < local_58)))) {
      cnv_00->toULength = (int8_t)local_58;
      *err = U_ILLEGAL_CHAR_FOUND;
      goto LAB_00382530;
    }
    uVar7 = i - offsetsFromUTF8[local_5c];
    if (uVar7 < 0x10000) {
      *(ushort *)sourceLimit = (ushort)uVar7;
      sourceLimit = sourceLimit + 2;
    }
    else {
      pUVar8 = (UChar *)(sourceLimit + 2);
      *(short *)sourceLimit = (short)(uVar7 >> 10) + -0x2840;
      UVar6 = (ushort)uVar7 & 0x3ff | 0xdc00;
      if (pUVar3 <= pUVar8) {
        cnv_00->UCharErrorBuffer[0] = UVar6;
        cnv_00->UCharErrorBufferLength = '\x01';
        *err = U_BUFFER_OVERFLOW_ERROR;
        sourceLimit = (uchar *)pUVar8;
        goto LAB_00382530;
      }
      sourceLimit = sourceLimit + 4;
      *pUVar8 = UVar6;
    }
LAB_003822bb:
    while( true ) {
      if (pUVar2 <= myTarget || pUVar3 <= sourceLimit) goto LAB_00382530;
      bVar1 = (byte)*myTarget;
      i = (int32_t)bVar1;
      if ((bVar1 & 0x80) != 0) break;
      *(ushort *)sourceLimit = (ushort)bVar1;
      sourceLimit = sourceLimit + 2;
      myTarget = (UChar *)((long)myTarget + 1);
    }
    cnv_00->toUBytes[0] = bVar1;
    if ((i - 0xc2U & 0xff) < 0x33) {
      local_64 = (uint)(0xdf < (uint)i) + (uint)(0xef < (uint)i) + 2;
    }
    else {
      local_64 = 0;
    }
    local_5c = local_64;
    local_58 = 1;
    myTarget = (UChar *)((long)myTarget + 1);
  } while( true );
}

Assistant:

U_CDECL_BEGIN
static void  U_CALLCONV ucnv_toUnicode_UTF8 (UConverterToUnicodeArgs * args,
                                  UErrorCode * err)
{
    UConverter *cnv = args->converter;
    const unsigned char *mySource = (unsigned char *) args->source;
    UChar *myTarget = args->target;
    const unsigned char *sourceLimit = (unsigned char *) args->sourceLimit;
    const UChar *targetLimit = args->targetLimit;
    unsigned char *toUBytes = cnv->toUBytes;
    UBool isCESU8 = hasCESU8Data(cnv);
    uint32_t ch, ch2 = 0;
    int32_t i, inBytes;

    /* Restore size of current sequence */
    if (cnv->toULength > 0 && myTarget < targetLimit)
    {
        inBytes = cnv->mode;            /* restore # of bytes to consume */
        i = cnv->toULength;             /* restore # of bytes consumed */
        cnv->toULength = 0;

        ch = cnv->toUnicodeStatus;/*Stores the previously calculated ch from a previous call*/
        cnv->toUnicodeStatus = 0;
        goto morebytes;
    }


    while (mySource < sourceLimit && myTarget < targetLimit)
    {
        ch = *(mySource++);
        if (U8_IS_SINGLE(ch))        /* Simple case */
        {
            *(myTarget++) = (UChar) ch;
        }
        else
        {
            /* store the first char */
            toUBytes[0] = (char)ch;
            inBytes = U8_COUNT_BYTES_NON_ASCII(ch); /* lookup current sequence length */
            i = 1;

morebytes:
            while (i < inBytes)
            {
                if (mySource < sourceLimit)
                {
                    toUBytes[i] = (char) (ch2 = *mySource);
                    if (!icu::UTF8::isValidTrail(ch, static_cast<uint8_t>(ch2), i, inBytes) &&
                            !(isCESU8 && i == 1 && ch == 0xed && U8_IS_TRAIL(ch2)))
                    {
                        break; /* i < inBytes */
                    }
                    ch = (ch << 6) + ch2;
                    ++mySource;
                    i++;
                }
                else
                {
                    /* stores a partially calculated target*/
                    cnv->toUnicodeStatus = ch;
                    cnv->mode = inBytes;
                    cnv->toULength = (int8_t) i;
                    goto donefornow;
                }
            }

            // In CESU-8, only surrogates, not supplementary code points, are encoded directly.
            if (i == inBytes && (!isCESU8 || i <= 3))
            {
                /* Remove the accumulated high bits */
                ch -= offsetsFromUTF8[inBytes];

                /* Normal valid byte when the loop has not prematurely terminated (i < inBytes) */
                if (ch <= MAXIMUM_UCS2) 
                {
                    /* fits in 16 bits */
                    *(myTarget++) = (UChar) ch;
                }
                else
                {
                    /* write out the surrogates */
                    *(myTarget++) = U16_LEAD(ch);
                    ch = U16_TRAIL(ch);
                    if (myTarget < targetLimit)
                    {
                        *(myTarget++) = (UChar)ch;
                    }
                    else
                    {
                        /* Put in overflow buffer (not handled here) */
                        cnv->UCharErrorBuffer[0] = (UChar) ch;
                        cnv->UCharErrorBufferLength = 1;
                        *err = U_BUFFER_OVERFLOW_ERROR;
                        break;
                    }
                }
            }
            else
            {
                cnv->toULength = (int8_t)i;
                *err = U_ILLEGAL_CHAR_FOUND;
                break;
            }
        }
    }

donefornow:
    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err))
    {
        /* End of target buffer */
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = myTarget;
    args->source = (const char *) mySource;
}